

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

bool __thiscall llvm::detail::DoubleAPFloat::isDenormal(DoubleAPFloat *this)

{
  APFloat *this_00;
  bool bVar1;
  fltCategory fVar2;
  cmpResult cVar3;
  bool bVar4;
  undefined1 auStack_38 [32];
  
  fVar2 = getCategory(this);
  if (fVar2 == fcNormal) {
    bVar1 = APFloat::isDenormal((this->Floats)._M_t.
                                super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                                .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl);
    bVar4 = true;
    if (!bVar1) {
      bVar1 = APFloat::isDenormal((this->Floats)._M_t.
                                  super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                                  .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl + 1);
      if (!bVar1) {
        this_00 = (this->Floats)._M_t.
                  super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
                  super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                  super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
        APFloat::operator+((APFloat *)auStack_38,this_00,this_00 + 1);
        cVar3 = APFloat::compare(this_00,(APFloat *)auStack_38);
        bVar4 = cVar3 != cmpEqual;
        APFloat::Storage::~Storage((Storage *)(auStack_38 + 8));
      }
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool DoubleAPFloat::isDenormal() const {
  return getCategory() == fcNormal &&
         (Floats[0].isDenormal() || Floats[1].isDenormal() ||
          // (double)(Hi + Lo) == Hi defines a normal number.
          Floats[0].compare(Floats[0] + Floats[1]) != cmpEqual);
}